

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::MultiThreadedTest::iterate(MultiThreadedTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  TestContext *this_00;
  TestThread *pTVar3;
  deUint64 dVar4;
  pointer ppTVar5;
  uint uVar6;
  pointer ppTVar7;
  char *description;
  IterateResult IVar8;
  int iVar9;
  qpTestResult testResult;
  ulong uVar10;
  size_type __new_size;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> messageNdx;
  vector<int,_std::allocator<int>_> local_1e8;
  ulong local_1c8;
  ulong local_1c0;
  deUint64 local_1b8;
  undefined1 local_1b0 [384];
  
  if (this->m_initialized == false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Thread timeout limit: ",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::reserve
              (&this->m_threads,(long)this->m_threadCount);
    if (0 < this->m_threadCount) {
      iVar9 = 0;
      do {
        pTVar3 = (TestThread *)operator_new(0x1b8);
        TestThread::TestThread(pTVar3,this,iVar9);
        local_1b0._0_8_ = pTVar3;
        std::vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>>::
        emplace_back<deqp::egl::TestThread*>
                  ((vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>> *)
                   &this->m_threads,(TestThread **)local_1b0);
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->m_threadCount);
    }
    dVar4 = deGetMicroseconds();
    this->m_startTimeUs = dVar4;
    ppTVar5 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_threads).
                                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
      lVar15 = 0;
      do {
        de::Thread::start(&ppTVar5[lVar15]->super_Thread);
        lVar15 = lVar15 + 1;
        ppTVar5 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar15 < (int)((ulong)((long)(this->m_threads).
                                            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppTVar5) >> 3));
    }
    this->m_initialized = true;
  }
  ppTVar5 = (this->m_threads).
            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(this->m_threads).
                               super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3);
  if ((int)uVar6 < 1) {
    iVar9 = 0;
  }
  else {
    uVar10 = 0;
    iVar9 = 0;
    do {
      iVar9 = iVar9 + (uint)(ppTVar5[uVar10]->m_status != THREADSTATUS_RUNNING);
      uVar10 = uVar10 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar10);
  }
  if (iVar9 == this->m_threadCount) {
    ppTVar5 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    __new_size = (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >> 3;
    if (0 < (int)__new_size) {
      lVar15 = 0;
      do {
        de::Thread::join(&ppTVar5[lVar15]->super_Thread);
        lVar15 = lVar15 + 1;
        ppTVar5 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5;
      } while (lVar15 < (int)(uVar10 >> 3));
      __new_size = (long)uVar10 >> 3;
    }
    bVar13 = false;
    if ((int)__new_size < 1) {
      bVar14 = true;
    }
    else {
      bVar14 = true;
      uVar10 = 0;
      bVar13 = false;
      do {
        if (ppTVar5[uVar10]->m_status == THREADSTATUS_ERROR) {
          bVar14 = false;
        }
        if (ppTVar5[uVar10]->m_status == THREADSTATUS_NOT_SUPPORTED) {
          bVar13 = true;
        }
        uVar10 = uVar10 + 1;
      } while ((__new_size & 0xffffffff) != uVar10);
    }
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::resize
              (&local_1e8,__new_size,(value_type_conflict1 *)local_1b0);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    do {
      ppTVar5 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (uint)((ulong)((long)(this->m_threads).
                                   super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)
      ;
      if ((int)uVar6 < 1) {
        iVar9 = -1;
      }
      else {
        iVar9 = -1;
        uVar11 = 0;
        uVar10 = 0;
        do {
          iVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11];
          pTVar3 = ppTVar5[uVar11];
          lVar15 = *(long *)&(pTVar3->m_log).m_messages.
                             super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                             ._M_impl.super__Vector_impl_data;
          iVar12 = (int)((ulong)((long)(pTVar3->m_log).m_messages.
                                       super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - lVar15) >> 3);
          if ((SBORROW4(iVar2,iVar12 * -0x33333333) != iVar2 + iVar12 * 0x33333333 < 0) &&
             ((iVar9 == -1 || (*(ulong *)(lVar15 + (long)iVar2 * 0x28) < uVar10)))) {
            uVar10 = *(ulong *)(lVar15 + (long)iVar2 * 0x28);
            iVar9 = (int)uVar11;
          }
          uVar11 = uVar11 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar11);
      }
      if (iVar9 == -1) break;
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] (",3);
      std::ostream::operator<<(poVar1,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
      lVar15 = *(long *)&((this->m_threads).
                          super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar9]->m_log).m_messages.
                         super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                         ._M_impl.super__Vector_impl_data;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 *(char **)(lVar15 + 8 +
                           (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar9] * 0x28),
                 *(long *)(lVar15 + 0x10 +
                          (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar9] * 0x28));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar9] =
           local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar9] + 1;
    } while (iVar9 != -1);
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    ppTVar5 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar7 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppTVar7 - (long)ppTVar5) >> 3)) {
      lVar15 = 0;
      do {
        if (ppTVar5[lVar15] != (TestThread *)0x0) {
          (*(ppTVar5[lVar15]->super_Thread)._vptr_Thread[1])();
        }
        lVar15 = lVar15 + 1;
        ppTVar5 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppTVar7 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (lVar15 < (int)((ulong)((long)ppTVar7 - (long)ppTVar5) >> 3));
    }
    if (ppTVar7 != ppTVar5) {
      (this->m_threads).
      super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar5;
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar14) {
      if (!bVar13) {
        tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      description = "Not Supported";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_00,testResult,description);
    IVar8 = STOP;
  }
  else {
    local_1b8 = deGetMicroseconds();
    local_1c8 = local_1b8 - this->m_startTimeUs;
    uVar10 = this->m_timeoutUs;
    if (uVar10 < local_1c8) {
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
      local_1c0 = uVar10;
      std::vector<int,_std::allocator<int>_>::resize
                (&local_1e8,
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_1b0);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      do {
        ppTVar5 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (uint)((ulong)((long)(this->m_threads).
                                     super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >>
                      3);
        if ((int)uVar6 < 1) {
          iVar9 = -1;
        }
        else {
          iVar9 = -1;
          uVar11 = 0;
          uVar10 = 0;
          do {
            iVar2 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
            pTVar3 = ppTVar5[uVar11];
            lVar15 = *(long *)&(pTVar3->m_log).m_messages.
                               super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                               ._M_impl.super__Vector_impl_data;
            iVar12 = (int)((ulong)((long)(pTVar3->m_log).m_messages.
                                         super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - lVar15) >> 3);
            if ((SBORROW4(iVar2,iVar12 * -0x33333333) != iVar2 + iVar12 * 0x33333333 < 0) &&
               ((iVar9 == -1 || (*(ulong *)(lVar15 + (long)iVar2 * 0x28) < uVar10)))) {
              uVar10 = *(ulong *)(lVar15 + (long)iVar2 * 0x28);
              iVar9 = (int)uVar11;
            }
            uVar11 = uVar11 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar11);
        }
        if (iVar9 == -1) break;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] (",3);
        std::ostream::operator<<(poVar1,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") ",2);
        lVar15 = *(long *)&((this->m_threads).
                            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar9]->m_log).m_messages.
                           super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                           ._M_impl.super__Vector_impl_data;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   *(char **)(lVar15 + 8 +
                             (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[iVar9] * 0x28),
                   *(long *)(lVar15 + 0x10 +
                            (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar9] * 0x28));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar9] =
             local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar9] + 1;
      } while (iVar9 != -1);
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      uVar10 = local_1c0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] (-) Timeout, Limit: ",0x16);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] (-) Trying to perform resource cleanup...",0x2b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      deSleep(10);
    }
    IVar8 = (IterateResult)(local_1c8 <= uVar10);
  }
  return IVar8;
}

Assistant:

TestCase::IterateResult MultiThreadedTest::iterate (void)
{
	if (!m_initialized)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Thread timeout limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;

		// Create threads
		m_threads.reserve(m_threadCount);

		for (int threadNdx = 0; threadNdx < m_threadCount; threadNdx++)
			m_threads.push_back(new TestThread(*this, threadNdx));

		m_startTimeUs = deGetMicroseconds();

		// Run threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->start();

		m_initialized = true;
	}

	int readyCount = 0;
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		if (m_threads[threadNdx]->getStatus() != TestThread::THREADSTATUS_RUNNING)
			readyCount++;
	}

	if (readyCount == m_threadCount)
	{
		// Join threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->join();

		bool isOk			= true;
		bool notSupported	= false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_ERROR)
				isOk = false;

			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_NOT_SUPPORTED)
				notSupported = true;
		}

		// Get logs
		{
			vector<int> messageNdx;

			messageNdx.resize(m_threads.size(), 0);

			while (true)
			{
				int			nextThreadNdx		= -1;
				deUint64	nextThreadTimeUs	= 0;

				for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				{
					if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
						continue;

					if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
					{
						nextThreadNdx		= threadNdx;
						nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
					}
				}

				if (nextThreadNdx == -1)
					break;

				m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

				messageNdx[nextThreadNdx]++;
			}
		}

		// Destroy threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			delete m_threads[threadNdx];

		m_threads.clear();

		// Set result
		if (isOk)
		{
			if (notSupported)
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
	else
	{
		// Check for timeout
		const deUint64 currentTimeUs = deGetMicroseconds();

		if (currentTimeUs - m_startTimeUs > m_timeoutUs)
		{
			// Get logs
			{
				vector<int> messageNdx;

				messageNdx.resize(m_threads.size(), 0);

				while (true)
				{
					int			nextThreadNdx		= -1;
					deUint64	nextThreadTimeUs	= 0;

					for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
					{
						if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
							continue;

						if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
						{
							nextThreadNdx		= threadNdx;
							nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
						}
					}

					if (nextThreadNdx == -1)
						break;

					m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

					messageNdx[nextThreadNdx]++;
				}
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Timeout, Limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Trying to perform resource cleanup..." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		// Sleep
		deSleep(10);
	}

	return CONTINUE;
}